

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fonts.h
# Opt level: O2

rectangle * __thiscall
dlib::font::
compute_cursor_rect<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>
          (rectangle *__return_storage_ptr__,font *this,rectangle *rect,
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          *str,unsigned_long index,size_type first,size_type last)

{
  uint ch_;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar4;
  ulong uVar5;
  size_type i;
  long lVar6;
  long local_50;
  
  uVar5 = str->_M_string_length - 1;
  if (last != 0xffffffffffffffff) {
    uVar5 = last;
  }
  iVar2 = (*this->_vptr_font[6])(this);
  local_50 = CONCAT44(extraout_var,iVar2);
  iVar2 = 0;
  if (str->_M_string_length == 0) {
    lVar6 = -1;
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    for (; (first <= uVar5 && (first < index)); first = first + 1) {
      ch_ = (str->_M_dataplus)._M_p[first];
      if (ch_ == 10) {
        iVar2 = (*this->_vptr_font[6])(this);
        local_50 = CONCAT44(extraout_var_00,iVar2);
        iVar2 = (*this->_vptr_font[4])(this);
        lVar4 = lVar4 + CONCAT44(extraout_var_01,iVar2);
        iVar2 = 0;
      }
      else {
        iVar2 = iVar2 + 1;
        bVar1 = is_combining_char<unsigned_int>(ch_);
        if ((!bVar1) && ((str->_M_dataplus)._M_p[first] != 0xd)) {
          iVar3 = (*this->_vptr_font[3])(this);
          local_50 = local_50 + (ulong)*(ushort *)(CONCAT44(extraout_var_02,iVar3) + 8);
        }
      }
    }
    lVar6 = -(ulong)(iVar2 == 0);
  }
  lVar6 = local_50 + lVar6 + rect->l;
  lVar4 = lVar4 + rect->t;
  iVar2 = (*this->_vptr_font[4])(this);
  __return_storage_ptr__->l = lVar6;
  __return_storage_ptr__->t = lVar4;
  __return_storage_ptr__->r = lVar6;
  __return_storage_ptr__->b = CONCAT44(extraout_var_03,iVar2) + lVar4 + -1;
  return __return_storage_ptr__;
}

Assistant:

const rectangle compute_cursor_rect (
            const rectangle& rect,
            const std::basic_string<T,traits,alloc>& str,
            unsigned long index,
            typename std::basic_string<T,traits,alloc>::size_type first = 0,
            typename std::basic_string<T,traits,alloc>::size_type last = (std::basic_string<T,traits,alloc>::npos)
        ) const
        {
            typedef std::basic_string<T,traits,alloc> string;
            DLIB_ASSERT ( (last == string::npos) || (first <= last && last < str.size())  ,
                          "\trectangle font::compute_cursor_rect()"
                          << "\n\tlast == string::npos: " << ((last == string::npos)?"true":"false") 
                          << "\n\tfirst: " << (unsigned long)first 
                          << "\n\tlast:  " << (unsigned long)last 
                          << "\n\tindex:  " << index
                          << "\n\tstr.size():  " << (unsigned long)str.size() );

            const font& f = *this;

            if (last == string::npos)
                last = str.size()-1;

            long x = f.left_overflow();
            long y = 0;
            int count = 0;

            if (str.size() != 0)
            {
                for (typename string::size_type i = first; i <= last && i < index; ++i)
                {
                    ++count;
                    if (str[i] == '\n')
                    {
                        x = f.left_overflow();
                        y += f.height();
                        count = 0;
                    }
                    else if (is_combining_char(str[i]) == false && 
                             str[i] != '\r')
                    {
                        x += f[str[i]].width();
                    }
                }
            }

            x += rect.left();
            y += rect.top();

            // if the cursor is at the start of a line then back it up one pixel
            if (count == 0)
                --x;

            return rectangle(x,y,x,y+f.height()-1);
        }